

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_blocksize.c
# Opt level: O1

unsigned_long parse_blocksize(char *bs)

{
  ulong uVar1;
  ushort **ppuVar2;
  ulong uVar3;
  byte bVar4;
  byte *local_20;
  
  uVar1 = strtoul(bs,(char **)&local_20,10);
  if ((*local_20 != 0) && (bVar4 = *local_20, bVar4 != 0)) {
    ppuVar2 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar2 + (ulong)bVar4 * 2 + 1) & 0x20) == 0) {
        uVar3 = (ulong)(bVar4 - 0x47);
        if (0x26 < bVar4 - 0x47) {
          return uVar1;
        }
        if ((0x100000001U >> (uVar3 & 0x3f) & 1) != 0) {
          return uVar1 << 0x1e;
        }
        if ((0x1000000010U >> (uVar3 & 0x3f) & 1) != 0) {
          return uVar1 << 10;
        }
        if ((0x4000000040U >> (uVar3 & 0x3f) & 1) == 0) {
          return uVar1;
        }
        return uVar1 << 0x14;
      }
      bVar4 = local_20[1];
      local_20 = local_20 + 1;
    } while (bVar4 != 0);
  }
  return uVar1;
}

Assistant:

unsigned long parse_blocksize(const char *bs)
{
    char *suf;
    unsigned long r = strtoul(bs, &suf, 10);
    if (*suf != '\0') {
        while (*suf && isspace((unsigned char)*suf)) suf++;
        switch (*suf) {
          case 'k': case 'K':
            r *= 1024ul;
            break;
          case 'm': case 'M':
            r *= 1024ul * 1024ul;
            break;
          case 'g': case 'G':
            r *= 1024ul * 1024ul * 1024ul;
            break;
          case '\0':
          default:
            break;
        }
    }
    return r;
}